

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O1

shared_ptr<gui::Style> __thiscall
gui::DefaultTheme::loadStyle(DefaultTheme *this,String *widgetName)

{
  anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
  *paVar1;
  bool bVar2;
  String *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<gui::Style> sVar5;
  locale local_60 [8];
  String local_58;
  
  std::locale::locale(local_60);
  sf::String::String(&local_58,"Button",local_60);
  bVar2 = sf::operator==(in_RDX,&local_58);
  paVar1 = &local_58.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,local_58.m_string._M_dataplus._M_p._0_4_)
      != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                             local_58.m_string._M_dataplus._M_p._0_4_));
  }
  std::locale::~locale(local_60);
  if (bVar2) {
    _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
            makeButtonStyle((DefaultTheme *)&local_58);
  }
  else {
    std::locale::locale(local_60);
    sf::String::String(&local_58,"ChatBox",local_60);
    bVar2 = sf::operator==(in_RDX,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                    local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                               local_58.m_string._M_dataplus._M_p._0_4_));
    }
    std::locale::~locale(local_60);
    if (bVar2) {
      _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
              makeChatBoxStyle((DefaultTheme *)&local_58);
    }
    else {
      std::locale::locale(local_60);
      sf::String::String(&local_58,"CheckBox",local_60);
      bVar2 = sf::operator==(in_RDX,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                      local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                 local_58.m_string._M_dataplus._M_p._0_4_));
      }
      std::locale::~locale(local_60);
      if (bVar2) {
        _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                makeCheckBoxStyle((DefaultTheme *)&local_58);
      }
      else {
        std::locale::locale(local_60);
        sf::String::String(&local_58,"ColorPicker",local_60);
        bVar2 = sf::operator==(in_RDX,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
             *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                        local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
          operator_delete((undefined1 *)
                          CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                   local_58.m_string._M_dataplus._M_p._0_4_));
        }
        std::locale::~locale(local_60);
        if (bVar2) {
          _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                  makeColorPickerStyle((DefaultTheme *)&local_58);
        }
        else {
          std::locale::locale(local_60);
          sf::String::String(&local_58,"DialogBox",local_60);
          bVar2 = sf::operator==(in_RDX,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
               *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                          local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
            operator_delete((undefined1 *)
                            CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                     local_58.m_string._M_dataplus._M_p._0_4_));
          }
          std::locale::~locale(local_60);
          if (bVar2) {
            _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                    makeDialogBoxStyle((DefaultTheme *)&local_58);
          }
          else {
            std::locale::locale(local_60);
            sf::String::String(&local_58,"Label",local_60);
            bVar2 = sf::operator==(in_RDX,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                 *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                            local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
              operator_delete((undefined1 *)
                              CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                       local_58.m_string._M_dataplus._M_p._0_4_));
            }
            std::locale::~locale(local_60);
            if (bVar2) {
              _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                      makeLabelStyle((DefaultTheme *)&local_58);
            }
            else {
              std::locale::locale(local_60);
              sf::String::String(&local_58,"MenuBar",local_60);
              bVar2 = sf::operator==(in_RDX,&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                   *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                              local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                operator_delete((undefined1 *)
                                CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                         local_58.m_string._M_dataplus._M_p._0_4_));
              }
              std::locale::~locale(local_60);
              if (bVar2) {
                _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                        makeMenuBarStyle((DefaultTheme *)&local_58);
              }
              else {
                std::locale::locale(local_60);
                sf::String::String(&local_58,"MultilineTextBox",local_60);
                bVar2 = sf::operator==(in_RDX,&local_58);
                if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                     *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                           local_58.m_string._M_dataplus._M_p._0_4_));
                }
                std::locale::~locale(local_60);
                if (bVar2) {
                  _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                          makeMultilineTextBoxStyle((DefaultTheme *)&local_58);
                }
                else {
                  std::locale::locale(local_60);
                  sf::String::String(&local_58,"Panel",local_60);
                  bVar2 = sf::operator==(in_RDX,&local_58);
                  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                       *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                  local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                             local_58.m_string._M_dataplus._M_p._0_4_));
                  }
                  std::locale::~locale(local_60);
                  if (bVar2) {
                    _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                            makePanelStyle((DefaultTheme *)&local_58);
                  }
                  else {
                    std::locale::locale(local_60);
                    sf::String::String(&local_58,"RadioButton",local_60);
                    bVar2 = sf::operator==(in_RDX,&local_58);
                    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                         *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                    local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                               local_58.m_string._M_dataplus._M_p._0_4_));
                    }
                    std::locale::~locale(local_60);
                    if (bVar2) {
                      _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                              makeRadioButtonStyle((DefaultTheme *)&local_58);
                    }
                    else {
                      std::locale::locale(local_60);
                      sf::String::String(&local_58,"Slider",local_60);
                      bVar2 = sf::operator==(in_RDX,&local_58);
                      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                           *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                      local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                                 local_58.m_string._M_dataplus._M_p._0_4_));
                      }
                      std::locale::~locale(local_60);
                      if (bVar2) {
                        _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                                makeSliderStyle((DefaultTheme *)&local_58);
                      }
                      else {
                        std::locale::locale(local_60);
                        sf::String::String(&local_58,"TextBox",local_60);
                        bVar2 = sf::operator==(in_RDX,&local_58);
                        if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
                             *)CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                        local_58.m_string._M_dataplus._M_p._0_4_) != paVar1) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_58.m_string._M_dataplus._M_p._4_4_,
                                                   local_58.m_string._M_dataplus._M_p._0_4_));
                        }
                        std::locale::~locale(local_60);
                        if (!bVar2) {
                          local_58.m_string._M_dataplus._M_p._0_4_ = 0;
                          local_58.m_string._M_dataplus._M_p._4_4_ = 0;
                          local_58.m_string._M_string_length._0_4_ = 0;
                          local_58.m_string._M_string_length._4_4_ = 0;
                          _Var3._M_pi = extraout_RDX;
                          goto LAB_0012f4d1;
                        }
                        _Var4 = (__shared_ptr<gui::ButtonStyle,_(__gnu_cxx::_Lock_policy)2>)
                                makeTextBoxStyle((DefaultTheme *)&local_58);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  _Var3 = _Var4._M_refcount._M_pi;
  (this->super_Theme).gui_ = (Gui *)0x0;
LAB_0012f4d1:
  *(undefined4 *)&(this->super_Theme)._vptr_Theme = local_58.m_string._M_dataplus._M_p._0_4_;
  *(undefined4 *)((long)&(this->super_Theme)._vptr_Theme + 4) =
       local_58.m_string._M_dataplus._M_p._4_4_;
  *(undefined4 *)&(this->super_Theme).gui_ = (undefined4)local_58.m_string._M_string_length;
  *(undefined4 *)((long)&(this->super_Theme).gui_ + 4) = local_58.m_string._M_string_length._4_4_;
  sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<gui::Style>)sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> DefaultTheme::loadStyle(const sf::String& widgetName) const {
    GUI_DEBUG << "Loading style for \"" << widgetName.toAnsiString() << "\".\n";
    if (widgetName == "Button") {
        return makeButtonStyle();
    } else if (widgetName == "ChatBox") {
        return makeChatBoxStyle();
    } else if (widgetName == "CheckBox") {
        return makeCheckBoxStyle();
    } else if (widgetName == "ColorPicker") {
        return makeColorPickerStyle();
    } else if (widgetName == "DialogBox") {
        return makeDialogBoxStyle();
    } else if (widgetName == "Label") {
        return makeLabelStyle();
    } else if (widgetName == "MenuBar") {
        return makeMenuBarStyle();
    } else if (widgetName == "MultilineTextBox") {
        return makeMultilineTextBoxStyle();
    } else if (widgetName == "Panel") {
        return makePanelStyle();
    } else if (widgetName == "RadioButton") {
        return makeRadioButtonStyle();
    } else if (widgetName == "Slider") {
        return makeSliderStyle();
    } else if (widgetName == "TextBox") {
        return makeTextBoxStyle();
    }

    // Normally if we don't find the widget, then fall back to the base class
    // version. In this case the base class doesn't implement it though.
    //return Theme::loadStyle(widgetName);
    return nullptr;
}